

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O0

void nested_markable::test_opt_opt_int(void)

{
  bool bVar1;
  representation_type *prVar2;
  representation_type *prVar3;
  reference_type piVar4;
  markable<ak_toolkit::markable_ns::mark_int<int,__1>,_ak_toolkit::markable_ns::order_none> local_24
  ;
  markable<ak_toolkit::markable_ns::mark_int<int,__1>,_ak_toolkit::markable_ns::order_none> local_20
  ;
  value_type local_1c;
  markable<ak_toolkit::markable_ns::mark_int<int,__1>,_ak_toolkit::markable_ns::order_none> local_18
  ;
  markable<ak_toolkit::markable_ns::mark_int<int,__1>,_ak_toolkit::markable_ns::order_none> local_14
  ;
  markable<ak_toolkit::markable_ns::mark_int<int,__1>,_ak_toolkit::markable_ns::order_none> local_10
  ;
  markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none> local_c;
  opt_int oi;
  optopt_int ooi;
  
  ak_toolkit::markable_ns::
  markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::markable(&local_c);
  bVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::has_value
                    (&local_c);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!ooi.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x476,"void nested_markable::test_opt_opt_int()");
  }
  prVar2 = ak_toolkit::markable_ns::
           markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::
           representation_value(&local_c);
  if (*prVar2 != -2) {
    __assert_fail("-2 == ooi.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x477,"void nested_markable::test_opt_opt_int()");
  }
  ak_toolkit::markable_ns::
  markable<ak_toolkit::markable_ns::mark_int<int,_-1>,_ak_toolkit::markable_ns::order_none>::
  markable(&local_10);
  prVar3 = ak_toolkit::markable_ns::
           markable<ak_toolkit::markable_ns::mark_int<int,_-1>,_ak_toolkit::markable_ns::order_none>
           ::representation_value(&local_10);
  if (*prVar3 != -1) {
    __assert_fail("-1 == oi.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x47b,"void nested_markable::test_opt_opt_int()");
  }
  bVar1 = ak_toolkit::markable_ns::
          markable<ak_toolkit::markable_ns::mark_int<int,_-1>,_ak_toolkit::markable_ns::order_none>
          ::has_value(&local_10);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oi.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x47c,"void nested_markable::test_opt_opt_int()");
  }
  ak_toolkit::markable_ns::
  markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::assign
            (&local_c,&local_10);
  bVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::has_value
                    (&local_c);
  if (!bVar1) {
    __assert_fail("ooi.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x47f,"void nested_markable::test_opt_opt_int()");
  }
  local_14._storage =
       (storage_type)
       ak_toolkit::markable_ns::
       markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::value(&local_c)
  ;
  bVar1 = ak_toolkit::markable_ns::
          markable<ak_toolkit::markable_ns::mark_int<int,_-1>,_ak_toolkit::markable_ns::order_none>
          ::has_value(&local_14);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!ooi.value().has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x480,"void nested_markable::test_opt_opt_int()");
  }
  prVar2 = ak_toolkit::markable_ns::
           markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::
           representation_value(&local_c);
  if (*prVar2 != -1) {
    __assert_fail("-1 == ooi.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x481,"void nested_markable::test_opt_opt_int()");
  }
  local_1c = 1;
  ak_toolkit::markable_ns::
  markable<ak_toolkit::markable_ns::mark_int<int,_-1>,_ak_toolkit::markable_ns::order_none>::
  markable(&local_18,&local_1c);
  ak_toolkit::markable_ns::
  markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::assign
            (&local_c,&local_18);
  bVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::has_value
                    (&local_c);
  if (!bVar1) {
    __assert_fail("ooi.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x484,"void nested_markable::test_opt_opt_int()");
  }
  local_20._storage =
       (storage_type)
       ak_toolkit::markable_ns::
       markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::value(&local_c)
  ;
  bVar1 = ak_toolkit::markable_ns::
          markable<ak_toolkit::markable_ns::mark_int<int,_-1>,_ak_toolkit::markable_ns::order_none>
          ::has_value(&local_20);
  if (!bVar1) {
    __assert_fail("ooi.value().has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x485,"void nested_markable::test_opt_opt_int()");
  }
  local_24._storage =
       (storage_type)
       ak_toolkit::markable_ns::
       markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::value(&local_c)
  ;
  piVar4 = ak_toolkit::markable_ns::
           markable<ak_toolkit::markable_ns::mark_int<int,_-1>,_ak_toolkit::markable_ns::order_none>
           ::value(&local_24);
  if (*piVar4 == 1) {
    prVar2 = ak_toolkit::markable_ns::
             markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::
             representation_value(&local_c);
    if (*prVar2 == 1) {
      return;
    }
    __assert_fail("1 == ooi.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x487,"void nested_markable::test_opt_opt_int()");
  }
  __assert_fail("ooi.value().value() == true",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x486,"void nested_markable::test_opt_opt_int()");
}

Assistant:

void test_opt_opt_int()
  {
    static_assert(sizeof(optopt_int) == sizeof(int), "excessive size");
    optopt_int ooi {};
    assert(!ooi.has_value());
    assert(-2 == ooi.representation_value());


    opt_int oi {};
    assert(-1 == oi.representation_value());
    assert(!oi.has_value());

    ooi.assign(oi);
    assert(ooi.has_value());
    assert(!ooi.value().has_value());
    assert(-1 == ooi.representation_value());

    ooi.assign(opt_int{1});
    assert(ooi.has_value());
    assert(ooi.value().has_value());
    assert(ooi.value().value() == true);
    assert(1 == ooi.representation_value());
  }